

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.periodic.c
# Opt level: O2

void pnga_periodic(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                  Integer op_code)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Integer *pIVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Integer IVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Integer type;
  void *local_548;
  Integer ndim;
  int counter [7];
  Integer hip [7];
  Integer dims [7];
  Integer range_num [7];
  undefined8 uStack_440;
  Integer lop [7];
  int local_3f8 [112];
  Integer offset [7] [3];
  Integer range [7] [6];
  
  local_548 = alpha;
  pnga_inquire(g_a,&type,&ndim,dims);
  lVar8 = 0;
  lVar9 = 0;
  if (0 < ndim) {
    lVar9 = ndim;
  }
  do {
    if (lVar9 == lVar8) {
      bVar21 = true;
      for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
        lVar14 = hip[lVar8];
        lVar13 = dims[lVar8];
        if (lVar13 < lVar14) {
          lVar10 = lVar14 / lVar13;
          lVar14 = lVar14 % lVar13;
          hip[lVar8] = lVar14;
          lVar15 = *(long *)(counter + lVar8 * 2) - lVar10 * lVar13;
          *(long *)(counter + lVar8 * 2) = lVar15;
          if (lVar10 != 0) {
            bVar21 = false;
          }
        }
        else {
          lVar15 = *(long *)(counter + lVar8 * 2);
        }
        if (lVar15 < 1) {
          lVar10 = lVar15 / lVar13 + 1;
          if (lVar10 != 0) {
            bVar21 = false;
          }
          lVar10 = lVar10 * lVar13;
          hip[lVar8] = lVar14 + lVar10;
          *(long *)(counter + lVar8 * 2) = lVar10 + lVar15;
        }
      }
      lVar8 = 0x40;
      lVar14 = 0x38;
      lVar13 = 0x28;
      lVar15 = 0x20;
      for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)range_num + lVar8 + 0x10) = 0;
        *(undefined1 (*) [16])((long)range_num + lVar8) = (undefined1  [16])0x0;
        *(undefined8 *)((long)range_num + lVar8 + 0x18) = 1;
        lVar4 = dims[lVar10];
        *(long *)((long)range_num + lVar8 + 0x20) = lVar4;
        *(undefined4 *)((long)range_num + lVar8 + 0x28) = 0;
        *(long *)((long)range_num + lVar8 + 0x30) = lVar4 + 1;
        *(undefined8 *)((long)&uStack_440 + lVar8) = 0;
        *(undefined4 *)((long)lop + lVar8) = 0;
        lVar18 = hip[lVar10];
        if (lVar18 < 1) {
          *(long *)((long)range_num + lVar8) = lVar18;
          *(undefined4 *)((long)range_num + lVar8 + 0x10) = 1;
          lVar18 = *(long *)(counter + lVar10 * 2);
          if (lVar4 < lVar18) {
            *(undefined4 *)((long)range_num + lVar8 + 0x28) = 1;
          }
        }
        else {
          *(long *)((long)range_num + lVar8 + 0x18) = lVar18;
          *(undefined4 *)((long)range_num + lVar8 + 0x28) = 1;
          lVar18 = *(long *)(counter + lVar10 * 2);
        }
        lVar19 = lVar13;
        lVar6 = lVar15;
        if (lVar4 < lVar18) {
          lVar19 = lVar8;
          lVar6 = lVar14;
        }
        *(long *)((long)lop + lVar6) = lVar18;
        *(undefined4 *)((long)lop + lVar19) = 1;
        lVar8 = lVar8 + 0x48;
        lVar14 = lVar14 + 0x48;
        lVar13 = lVar13 + 0x48;
        lVar15 = lVar15 + 0x48;
      }
      bVar7 = true;
      pIVar11 = lop + 2;
      lVar8 = lVar9;
      while (bVar20 = lVar8 != 0, lVar8 = lVar8 + -1, bVar20) {
        if (((int)*pIVar11 != 0) || ((int)pIVar11[6] != 0)) {
          bVar7 = false;
        }
        pIVar11 = pIVar11 + 9;
      }
      if ((bVar7) && (bVar21)) {
        if (op_code == 3) {
          pnga_acc(g_a,lo,hi,buf,ld,local_548);
        }
        else if (op_code == 2) {
          pnga_put(g_a,lo,hi,buf,ld);
        }
        else if (op_code == 1) {
          pnga_get(g_a,lo,hi,buf,ld);
        }
        else {
          pnga_error("This operation is invalid ",0);
        }
        return;
      }
      piVar12 = local_3f8;
      lVar8 = 0;
      for (lVar14 = 0; lVar9 != lVar14; lVar14 = lVar14 + 1) {
        range_num[lVar14] = 0;
        bVar21 = piVar12[-0xc] != 0;
        if (bVar21) {
          lVar15 = *(long *)(piVar12 + -0x10);
          lVar4 = *(long *)(piVar12 + -0xe);
          lVar13 = dims[lVar14];
          auVar22._8_4_ = (int)lVar13;
          auVar22._0_8_ = lVar13;
          auVar22._12_4_ = (int)((ulong)lVar13 >> 0x20);
          lVar10 = hip[lVar14];
          *(long *)((long)range[0] + lVar8 * 2) = lVar13 + *(long *)(piVar12 + -0x10);
          *(long *)((long)range[0] + lVar8 * 2 + 8) = auVar22._8_8_ + lVar4;
          *(long *)((long)offset[0] + lVar8) = lVar15 - lVar10;
          range_num[lVar14] = 1;
        }
        uVar17 = (ulong)bVar21;
        if (piVar12[-6] != 0) {
          lVar13 = *(long *)(piVar12 + -10);
          uVar5 = *(undefined8 *)(piVar12 + -8);
          puVar1 = (undefined8 *)((long)range[0] + lVar8 * 2 + (ulong)bVar21 * 0x10);
          *puVar1 = *(undefined8 *)(piVar12 + -10);
          puVar1[1] = uVar5;
          *(long *)((long)offset[0] + lVar8 + uVar17 * 8) = lVar13 - hip[lVar14];
          uVar17 = uVar17 + 1;
          range_num[lVar14] = uVar17;
        }
        if (*piVar12 != 0) {
          lVar15 = *(long *)(piVar12 + -4);
          lVar10 = *(long *)(piVar12 + -2);
          lVar13 = dims[lVar14];
          auVar23._8_4_ = (int)lVar13;
          auVar23._0_8_ = lVar13;
          auVar23._12_4_ = (int)((ulong)lVar13 >> 0x20);
          plVar2 = (long *)((long)range[0] + lVar8 * 2 + (ulong)(uint)((int)uVar17 << 4));
          *plVar2 = *(long *)(piVar12 + -4) - lVar13;
          plVar2[1] = lVar10 - auVar23._8_8_;
          *(long *)((long)offset[0] + lVar8 + uVar17 * 8) = lVar15 - hip[lVar14];
          range_num[lVar14] = uVar17 + 1;
        }
        lVar8 = lVar8 + 0x18;
        piVar12 = piVar12 + 0x12;
      }
      goto LAB_00121bc1;
    }
    lVar14 = lo[lVar8];
    hip[lVar8] = lVar14;
    lVar13 = hi[lVar8];
    *(long *)(counter + lVar8 * 2) = lVar13;
    lVar13 = lVar13 - lVar14;
  } while ((-1 < lVar13) &&
          (plVar2 = dims + lVar8, lVar8 = lVar8 + 1,
          SBORROW8(lVar13,*plVar2 * 2) != lVar13 + *plVar2 * -2 < 0));
  pnga_error("g_a indices are invalid ",0);
  lVar9 = 0;
  if (0 < ndim) {
    lVar9 = ndim;
  }
LAB_00121bc1:
  for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
    counter[lVar8] = 0;
  }
  do {
    IVar16 = ndim;
    if (ndim < 1) {
      IVar16 = 0;
    }
    lVar8 = 0;
    for (lVar9 = 0; lVar9 != IVar16; lVar9 = lVar9 + 1) {
      iVar3 = counter[lVar9];
      lVar14 = (long)iVar3;
      lop[lVar9] = range[lVar9][lVar14 * 2];
      hip[lVar9] = range[lVar9][iVar3 * 2 + 1];
      if (lVar9 == 0) {
        lVar14 = offset[0][lVar14];
      }
      else {
        lVar14 = offset[lVar9][lVar14];
        for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 1) {
          lVar14 = lVar14 * ld[lVar13];
        }
      }
      lVar8 = lVar8 + lVar14;
    }
    if (op_code == 3) {
      pnga_acc(g_a,lop,hip,
               (void *)(lVar8 * *(long *)((long)&QWORD_001ce584 + type * 0x10 + 4) + (long)buf),ld,
               local_548);
    }
    else if (op_code == 2) {
      pnga_put(g_a,lop,hip,
               (void *)(lVar8 * *(long *)((long)&QWORD_001ce584 + type * 0x10 + 4) + (long)buf),ld);
    }
    else if (op_code == 1) {
      pnga_get(g_a,lop,hip,
               (void *)(lVar8 * *(long *)((long)&QWORD_001ce584 + type * 0x10 + 4) + (long)buf),ld);
    }
    else {
      pnga_error("This operation is invalid ",0);
    }
    counter[0] = counter[0] + 1;
    lVar9 = 0;
    if (0 < ndim) {
      lVar9 = ndim;
    }
    for (lVar8 = 0; lVar8 != lVar9; lVar8 = lVar8 + 1) {
      if (range_num[lVar8] == (long)counter[lVar8]) {
        counter[lVar8] = 0;
        if (ndim + -1 == lVar8) {
          return;
        }
        counter[lVar8 + 1] = counter[lVar8 + 1] + 1;
      }
    }
  } while( true );
}

Assistant:

void pnga_periodic(Integer g_a, Integer *lo, Integer *hi, void *buf,
                    Integer *ld, void *alpha, Integer op_code)
{
    int i, j, counter[MAXDIM], done;
    Integer type, ndim, dims[MAXDIM];
    Integer range[MAXDIM][RANGE_BOUND], range_num[MAXDIM];
    Integer offset[MAXDIM][RANGE_BOUND/2], my_offset, temp_offset;
    Integer lop[MAXDIM], hip[MAXDIM];
    int get_range;
    
    pnga_inquire(g_a, &type, &ndim, dims);

    get_range = ngai_peri_get_range_(ndim, dims, lo, hi, range, range_num,
                                     offset, op_code);
    
    if(!get_range) pnga_error("g_a indices are invalid ", 0L);

    /* If this is a regular patch, not periodic operation needed */
    if(get_range == IS_REGULAR_PATCH) {
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_ACC:    
              pnga_acc(g_a, lo, hi, buf, ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }
        return;
    }

    /* periodic operation continues */
    for(i=0; i<ndim; i++) counter[i] = 0;

    done = 0;
    do {
        my_offset = 0;
        
        for(i=0; i<ndim; i++) {
            lop[i] = range[i][counter[i]*2];
            hip[i] = range[i][counter[i]*2+1];

            /* calculate the offset */
            if(i == 0) my_offset += offset[i][counter[i]];
            else {
                temp_offset = offset[i][counter[i]];
                for(j=0; j<i; j++)
                    /* temp_offset *= dims[j]; */
                    temp_offset *= ld[j];
                my_offset += temp_offset;
            }
        }
        
        /* deal with this patch */
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_ACC:
              pnga_acc(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }      

        counter[0]++;
        for(i=0; i<ndim; i++) {
            if(counter[i] == range_num[i]) {
                counter[i] = 0;
                if(i == (ndim-1)) { done = 1; break; }
                else counter[i+1]++;
            }
        }
    } while(!done);
}